

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_struct_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_struct_f *pf)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  size_t __n;
  ulong uVar5;
  void *pvVar6;
  size_t __n_00;
  
  uVar2 = id * 2 + 4;
  if ((uVar2 < (uint)td->vsize) &&
     (uVar5 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar2), uVar5 != 0)) {
    pvVar6 = (void *)(uVar5 + (long)td->table);
  }
  else {
    pvVar6 = (void *)0x0;
  }
  if (pvVar6 != (void *)0x0) {
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar4 = ctx->p;
      ctx->p = pcVar4 + 1;
      *pcVar4 = ',';
    }
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar4 = ctx->p;
    ctx->p = pcVar4 + 1;
    *pcVar4 = '{';
    (*pf)(ctx,pvVar6);
    if (ctx->indent != '\0') {
      pcVar4 = ctx->p;
      ctx->p = pcVar4 + 1;
      *pcVar4 = '\n';
      lVar3 = (long)ctx->level + -1;
      ctx->level = (int)lVar3;
      __n = (ulong)ctx->indent * lVar3;
      pcVar4 = ctx->p;
      if (ctx->pflush < pcVar4 + __n) {
        if (ctx->pflush <= pcVar4) {
          (*ctx->flush)(ctx,0);
        }
        __n_00 = (long)ctx->pflush - (long)ctx->p;
        if (__n_00 < __n) {
          do {
            memset(ctx->p,0x20,__n_00);
            ctx->p = ctx->p + __n_00;
            __n = __n - __n_00;
            (*ctx->flush)(ctx,0);
            __n_00 = (long)ctx->pflush - (long)ctx->p;
          } while (__n_00 < __n);
        }
        pcVar4 = ctx->p;
      }
      memset(pcVar4,0x20,__n);
      ctx->p = ctx->p + __n;
    }
    pcVar4 = ctx->p;
    ctx->p = pcVar4 + 1;
    *pcVar4 = '}';
  }
  return;
}

Assistant:

void flatcc_json_printer_struct_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_struct_f *pf)
{
    const void *p = get_field_ptr(td, id);

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        print_name(ctx, name, len);
        print_start('{');
        pf(ctx, p);
        print_end('}');
    }
}